

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O3

int xmlC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur,xmlNsPtr ns)

{
  xmlChar *pxVar1;
  xmlNsPtr pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  int iVar6;
  xmlNsPtr *ppxVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  
  if (cur == (xmlC14NVisibleNsStackPtr)0x0) {
    xmlC14NErrFull((xmlC14NCtxPtr)0x0,(xmlNodePtr)0x0,0x73,(char *)0x0,"Invalid argument\n",0);
    return 0;
  }
  if (ns == (xmlNsPtr)0x0) {
    pxVar5 = "";
    pxVar4 = "";
  }
  else {
    pxVar5 = ns->prefix;
    if (pxVar5 == (xmlChar *)0x0) {
      pxVar5 = "";
    }
    pxVar4 = ns->href;
    if (pxVar4 == (xmlChar *)0x0) {
      pxVar4 = "";
    }
  }
  if (*pxVar5 == '\0') {
    ppxVar7 = cur->nsTab;
    if (ppxVar7 == (xmlNsPtr *)0x0) {
      return (uint)(*pxVar4 == '\0');
    }
    if (*pxVar4 == '\0') {
      iVar9 = 0;
      iVar6 = 1;
      goto LAB_00162893;
    }
  }
  else {
    ppxVar7 = cur->nsTab;
    if (ppxVar7 == (xmlNsPtr *)0x0) {
      return 0;
    }
  }
  iVar9 = cur->nsPrevStart;
  iVar6 = 0;
LAB_00162893:
  uVar8 = (ulong)(uint)cur->nsCurEnd;
  do {
    if ((int)uVar8 <= iVar9) {
      return iVar6;
    }
    uVar8 = (ulong)(int)uVar8;
    while( true ) {
      pxVar2 = ppxVar7[uVar8 - 1];
      uVar8 = uVar8 - 1;
      if (pxVar2 == (xmlNsPtr)0x0) break;
      pxVar3 = pxVar2->prefix;
      if (pxVar5 == pxVar3) goto LAB_001628e2;
      if (pxVar3 == (xmlChar *)0x0) break;
      lVar10 = 0;
      while (pxVar1 = pxVar5 + lVar10, *pxVar1 == pxVar3[lVar10]) {
        lVar10 = lVar10 + 1;
        if (*pxVar1 == '\0') goto LAB_001628e2;
      }
      if ((long)uVar8 <= (long)iVar9) {
        return iVar6;
      }
    }
    if (*pxVar5 == '\0') {
      if (pxVar2 != (xmlNsPtr)0x0) {
LAB_001628e2:
        pxVar5 = pxVar2->href;
        if (pxVar4 == pxVar5) {
          return 1;
        }
        if (pxVar5 != (xmlChar *)0x0) {
          lVar10 = 0;
          do {
            pxVar3 = pxVar4 + lVar10;
            if (*pxVar3 != pxVar5[lVar10]) {
              return 0;
            }
            lVar10 = lVar10 + 1;
          } while (*pxVar3 != '\0');
          return 1;
        }
      }
      return (uint)(*pxVar4 == '\0');
    }
  } while( true );
}

Assistant:

static int
xmlC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur, xmlNsPtr ns)
{
    int i;
    const xmlChar *prefix;
    const xmlChar *href;
    int has_empty_ns;

    if(cur == NULL) {
        xmlC14NErrParam(NULL);
        return (0);
    }

    /*
     * if the default namespace xmlns="" is not defined yet then
     * we do not want to print it out
     */
    prefix = ((ns == NULL) || (ns->prefix == NULL)) ? BAD_CAST "" : ns->prefix;
    href = ((ns == NULL) || (ns->href == NULL)) ? BAD_CAST "" : ns->href;
    has_empty_ns = (xmlC14NStrEqual(prefix, NULL) && xmlC14NStrEqual(href, NULL));

    if (cur->nsTab != NULL) {
	int start = (has_empty_ns) ? 0 : cur->nsPrevStart;
        for (i = cur->nsCurEnd - 1; i >= start; --i) {
            xmlNsPtr ns1 = cur->nsTab[i];

	    if(xmlC14NStrEqual(prefix, (ns1 != NULL) ? ns1->prefix : NULL)) {
		return(xmlC14NStrEqual(href, (ns1 != NULL) ? ns1->href : NULL));
	    }
        }
    }
    return(has_empty_ns);
}